

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_char>::get_index<unsigned_char>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_char> *this,
          CImg<unsigned_char> *colormap,float dithering,bool map_indexes)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uint *puVar4;
  float *pfVar5;
  float *pfVar6;
  CImgArgumentException *this_00;
  long lVar7;
  byte *pbVar8;
  uint *puVar9;
  int iVar10;
  float *pfVar11;
  uint *puVar12;
  float *pfVar13;
  float *pfVar14;
  uchar *puVar15;
  float *pfVar16;
  uint uVar17;
  uint uVar18;
  byte *pbVar19;
  float *pfVar20;
  uint uVar21;
  float *pfVar22;
  byte *pbVar23;
  uint size_c;
  uchar *ptrp_end_4;
  byte *pbVar24;
  uchar *ptrp_end_1;
  ulong uVar25;
  byte *pbVar26;
  byte *pbVar27;
  long lVar28;
  char *pcVar29;
  uchar *ptrp_end_2;
  long lVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  uint *puVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  long local_e8;
  uint *local_d8;
  uint *local_d0;
  Tfloat valm;
  long local_c0;
  CImg<unsigned_int> *local_b8;
  uint *local_b0;
  CImg<unsigned_char> *local_a8;
  float *local_a0;
  float *local_98;
  uchar *local_90;
  long local_88;
  float *local_80;
  uchar *local_78;
  CImg<unsigned_char> local_70;
  CImg<float> cache;
  
  uVar32 = colormap->_spectrum;
  local_a8 = colormap;
  if (uVar32 != this->_spectrum) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar29 = "non-";
    if (this->_is_shared != false) {
      pcVar29 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::index(): Instance and specified colormap (%u,%u,%u,%u,%p) have incompatible dimensions."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar29,"unsigned char",(ulong)local_a8->_width,(ulong)local_a8->_height,
               (ulong)local_a8->_depth,(ulong)local_a8->_spectrum,local_a8->_data);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((uVar32 != 0) && (this->_data != (uchar *)0x0)) {
    uVar17 = this->_width;
    if (uVar17 != 0) {
      uVar21 = this->_height;
      if (uVar21 != 0) {
        uVar18 = this->_depth;
        if (uVar18 != 0) {
          lVar33 = (ulong)uVar21 * (ulong)uVar17 * (ulong)uVar18;
          lVar31 = (ulong)colormap->_depth * (ulong)colormap->_height * (ulong)colormap->_width;
          size_c = 1;
          if (map_indexes) {
            size_c = uVar32;
          }
          CImg<unsigned_int>::CImg(__return_storage_ptr__,uVar17,uVar21,uVar18,size_c);
          if (dithering <= 0.0) {
            uVar32 = this->_depth;
            uVar17 = this->_spectrum;
            if (uVar17 == 1) {
              if ((int)uVar32 < 1) {
                return __return_storage_ptr__;
              }
              puVar35 = __return_storage_ptr__->_data;
              puVar15 = this->_data;
              uVar17 = this->_height;
              lVar33 = 0;
              do {
                if (0 < (int)uVar17) {
                  pbVar3 = local_a8->_data;
                  lVar7 = 0;
                  do {
                    uVar25 = (ulong)this->_width;
                    if (uVar25 != 0) {
                      pbVar24 = puVar15 + (ulong)uVar17 * lVar33 * uVar25 + lVar7 * uVar25;
                      pbVar23 = pbVar24 + uVar25;
                      puVar12 = puVar35 + lVar7 * (ulong)__return_storage_ptr__->_width +
                                          (ulong)__return_storage_ptr__->_height *
                                          (ulong)__return_storage_ptr__->_width * lVar33;
                      do {
                        pbVar26 = pbVar3;
                        if (0 < lVar31) {
                          fVar36 = 3.4028235e+38;
                          pbVar27 = pbVar3;
                          do {
                            fVar37 = ((float)*pbVar27 - (float)*pbVar24) *
                                     ((float)*pbVar27 - (float)*pbVar24);
                            if (fVar37 < fVar36) {
                              pbVar26 = pbVar27;
                            }
                            pbVar27 = pbVar27 + 1;
                            if (fVar36 <= fVar37) {
                              fVar37 = fVar36;
                            }
                            fVar36 = fVar37;
                          } while (pbVar27 < pbVar3 + lVar31);
                        }
                        if (map_indexes) {
                          uVar32 = (uint)*pbVar26;
                        }
                        else {
                          uVar32 = (int)pbVar26 - (int)pbVar3;
                        }
                        pbVar24 = pbVar24 + 1;
                        *puVar12 = uVar32;
                        puVar12 = puVar12 + 1;
                      } while (pbVar24 < pbVar23);
                      uVar17 = this->_height;
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < (int)uVar17);
                  uVar32 = this->_depth;
                }
                lVar33 = lVar33 + 1;
              } while (lVar33 < (int)uVar32);
              return __return_storage_ptr__;
            }
            if (uVar17 == 2) {
              if ((int)uVar32 < 1) {
                return __return_storage_ptr__;
              }
              puVar35 = __return_storage_ptr__->_data;
              puVar15 = this->_data;
              uVar17 = this->_height;
              lVar7 = 0;
              do {
                if (0 < (int)uVar17) {
                  pbVar3 = local_a8->_data;
                  lVar34 = 0;
                  do {
                    uVar25 = (ulong)this->_width;
                    if (uVar25 != 0) {
                      pbVar26 = puVar15 + (ulong)uVar17 * lVar7 * uVar25 + lVar34 * uVar25;
                      pbVar24 = pbVar26 + uVar25;
                      pbVar23 = pbVar26 + lVar33;
                      puVar12 = puVar35 + lVar34 * (ulong)__return_storage_ptr__->_width +
                                          (ulong)__return_storage_ptr__->_height *
                                          (ulong)__return_storage_ptr__->_width * lVar7;
                      puVar9 = puVar12 + lVar33;
                      do {
                        pbVar27 = pbVar3;
                        if (0 < lVar31) {
                          pbVar19 = pbVar3;
                          fVar36 = 3.4028235e+38;
                          do {
                            fVar37 = ((float)*pbVar19 - (float)*pbVar26) *
                                     ((float)*pbVar19 - (float)*pbVar26) +
                                     ((float)pbVar19[lVar31] - (float)*pbVar23) *
                                     ((float)pbVar19[lVar31] - (float)*pbVar23);
                            if (fVar37 < fVar36) {
                              pbVar27 = pbVar19;
                            }
                            pbVar19 = pbVar19 + 1;
                            if (fVar36 <= fVar37) {
                              fVar37 = fVar36;
                            }
                            fVar36 = fVar37;
                          } while (pbVar19 < pbVar3 + lVar31);
                        }
                        if (map_indexes) {
                          *puVar12 = (uint)*pbVar27;
                          *puVar9 = (uint)pbVar27[lVar31];
                          puVar9 = puVar9 + 1;
                        }
                        else {
                          *puVar12 = (int)pbVar27 - (int)pbVar3;
                        }
                        pbVar26 = pbVar26 + 1;
                        pbVar23 = pbVar23 + 1;
                        puVar12 = puVar12 + 1;
                      } while (pbVar26 < pbVar24);
                      uVar17 = this->_height;
                    }
                    lVar34 = lVar34 + 1;
                  } while (lVar34 < (int)uVar17);
                  uVar32 = this->_depth;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)uVar32);
              return __return_storage_ptr__;
            }
            if (uVar17 != 3) {
              if ((int)uVar32 < 1) {
                return __return_storage_ptr__;
              }
              puVar35 = __return_storage_ptr__->_data;
              puVar15 = this->_data;
              uVar17 = this->_height;
              local_e8 = 0;
              do {
                if (0 < (int)uVar17) {
                  pbVar3 = local_a8->_data;
                  lVar7 = 0;
                  do {
                    uVar25 = (ulong)this->_width;
                    if (uVar25 != 0) {
                      pbVar23 = puVar15 + (ulong)uVar17 * local_e8 * uVar25 + lVar7 * uVar25;
                      pbVar24 = pbVar23 + uVar25;
                      puVar12 = puVar35 + lVar7 * (ulong)__return_storage_ptr__->_width +
                                          (ulong)__return_storage_ptr__->_height *
                                          (ulong)__return_storage_ptr__->_width * local_e8;
                      do {
                        pbVar26 = pbVar3;
                        if (0 < lVar31) {
                          fVar36 = 3.4028235e+38;
                          pbVar27 = pbVar3;
                          do {
                            fVar37 = 0.0;
                            pbVar19 = pbVar27;
                            pbVar8 = pbVar23;
                            uVar32 = this->_spectrum;
                            if (0 < (int)this->_spectrum) {
                              do {
                                fVar37 = fVar37 + ((float)*pbVar8 - (float)*pbVar19) *
                                                  ((float)*pbVar8 - (float)*pbVar19);
                                uVar32 = uVar32 - 1;
                                pbVar19 = pbVar19 + lVar31;
                                pbVar8 = pbVar8 + lVar33;
                              } while (uVar32 != 0);
                            }
                            pbVar19 = pbVar27;
                            if (fVar36 <= fVar37) {
                              pbVar19 = pbVar26;
                              fVar37 = fVar36;
                            }
                            fVar36 = fVar37;
                            pbVar26 = pbVar19;
                            pbVar27 = pbVar27 + 1;
                          } while (pbVar27 < pbVar3 + lVar31);
                        }
                        if (map_indexes) {
                          if (0 < (int)this->_spectrum) {
                            iVar2 = 0;
                            puVar9 = puVar12;
                            do {
                              *puVar9 = (uint)*pbVar26;
                              pbVar26 = pbVar26 + lVar31;
                              iVar2 = iVar2 + 1;
                              puVar9 = puVar9 + lVar33;
                            } while (iVar2 < (int)this->_spectrum);
                          }
                        }
                        else {
                          *puVar12 = (int)pbVar26 - (int)pbVar3;
                        }
                        puVar12 = puVar12 + 1;
                        pbVar23 = pbVar23 + 1;
                      } while (pbVar23 < pbVar24);
                      uVar17 = this->_height;
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < (int)uVar17);
                  uVar32 = this->_depth;
                }
                local_e8 = local_e8 + 1;
              } while (local_e8 < (int)uVar32);
              return __return_storage_ptr__;
            }
            if ((int)uVar32 < 1) {
              return __return_storage_ptr__;
            }
            puVar35 = __return_storage_ptr__->_data;
            puVar15 = this->_data;
            uVar17 = this->_height;
            local_c0 = 0;
            do {
              if (0 < (int)uVar17) {
                pbVar3 = local_a8->_data;
                lVar7 = 0;
                do {
                  uVar25 = (ulong)this->_width;
                  if (uVar25 != 0) {
                    pbVar27 = puVar15 + (ulong)uVar17 * local_c0 * uVar25 + lVar7 * uVar25;
                    pbVar26 = pbVar27 + uVar25;
                    pbVar23 = pbVar27 + lVar33;
                    pbVar24 = pbVar23 + lVar33;
                    puVar12 = puVar35 + lVar7 * (ulong)__return_storage_ptr__->_width +
                                        (ulong)__return_storage_ptr__->_height *
                                        (ulong)__return_storage_ptr__->_width * local_c0;
                    puVar9 = puVar12 + lVar33;
                    puVar4 = puVar9 + lVar33;
                    do {
                      pbVar19 = pbVar3;
                      if (0 < lVar31) {
                        pbVar8 = pbVar3;
                        fVar36 = 3.4028235e+38;
                        do {
                          fVar37 = ((float)pbVar8[lVar31 * 2] - (float)*pbVar24) *
                                   ((float)pbVar8[lVar31 * 2] - (float)*pbVar24) +
                                   ((float)*pbVar8 - (float)*pbVar27) *
                                   ((float)*pbVar8 - (float)*pbVar27) +
                                   ((float)pbVar8[lVar31] - (float)*pbVar23) *
                                   ((float)pbVar8[lVar31] - (float)*pbVar23);
                          if (fVar37 < fVar36) {
                            pbVar19 = pbVar8;
                          }
                          pbVar8 = pbVar8 + 1;
                          if (fVar36 <= fVar37) {
                            fVar37 = fVar36;
                          }
                          fVar36 = fVar37;
                        } while (pbVar8 < pbVar3 + lVar31);
                      }
                      if (map_indexes) {
                        *puVar12 = (uint)*pbVar19;
                        *puVar9 = (uint)pbVar19[lVar31];
                        puVar9 = puVar9 + 1;
                        *puVar4 = (uint)pbVar19[lVar31 * 2];
                        puVar4 = puVar4 + 1;
                      }
                      else {
                        *puVar12 = (int)pbVar19 - (int)pbVar3;
                      }
                      pbVar27 = pbVar27 + 1;
                      pbVar23 = pbVar23 + 1;
                      pbVar24 = pbVar24 + 1;
                      puVar12 = puVar12 + 1;
                    } while (pbVar27 < pbVar26);
                    uVar17 = this->_height;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 < (int)uVar17);
                uVar32 = this->_depth;
              }
              local_c0 = local_c0 + 1;
            } while (local_c0 < (int)uVar32);
            return __return_storage_ptr__;
          }
          puVar35 = __return_storage_ptr__->_data;
          valm = 0.0;
          local_b8 = __return_storage_ptr__;
          pbVar3 = max_min<float>(this,&valm);
          fVar36 = (float)*pbVar3;
          if ((valm == fVar36) && (0.0 <= valm)) {
            valm = 0.0;
            fVar36 = 255.0;
          }
          local_c0 = CONCAT44(local_c0._4_4_,fVar36);
          get_crop(&local_70,this,-1,0,0,0,this->_width,1,0,this->_spectrum - 1,0);
          CImg<float>::CImg<unsigned_char>(&cache,&local_70);
          fVar36 = 1.0;
          if (dithering <= 1.0) {
            fVar36 = dithering;
          }
          if ((local_70._is_shared == false) && (local_70._data != (uchar *)0x0)) {
            operator_delete__(local_70._data);
          }
          fVar36 = fVar36 * 0.0625;
          pfVar6 = cache._data + 1;
          local_80 = cache._data;
          pfVar16 = cache._data + (ulong)cache._width + 1;
          lVar7 = (ulong)cache._height * (ulong)cache._width * (ulong)cache._depth;
          uVar32 = this->_depth;
          uVar17 = this->_spectrum;
          if (uVar17 == 3) {
            if (0 < (int)uVar32) {
              local_d0 = puVar35 + lVar33;
              local_b0 = local_d0 + lVar33;
              uVar17 = this->_height;
              local_90 = (uchar *)0x0;
              do {
                if (0 < (int)uVar17) {
                  local_78 = this->_data;
                  pbVar3 = local_a8->_data;
                  uVar32 = this->_width;
                  lVar34 = 0;
                  pfVar5 = pfVar6;
                  uVar21 = uVar32;
                  do {
                    pfVar6 = pfVar16;
                    pfVar16 = pfVar5;
                    uVar18 = uVar21;
                    if (lVar34 < (int)(uVar17 - 2)) {
                      if (0 < (int)uVar21) {
                        pbVar23 = local_78 +
                                  (ulong)uVar17 * (long)local_90 * (ulong)uVar21 +
                                  (lVar34 + 1) * (ulong)uVar21;
                        pfVar5 = pfVar6;
                        do {
                          *pfVar5 = (float)*pbVar23;
                          pfVar5[lVar7] = (float)pbVar23[lVar33];
                          pbVar24 = pbVar23 + lVar33 * 2;
                          pbVar23 = pbVar23 + 1;
                          pfVar5[lVar7 * 2] = (float)*pbVar24;
                          pfVar5 = pfVar5 + 1;
                          uVar21 = uVar21 - 1;
                          uVar18 = uVar32;
                          local_a0 = pfVar6;
                        } while (uVar21 != 0);
                        goto LAB_001911ba;
                      }
                    }
                    else {
LAB_001911ba:
                      uVar21 = uVar18;
                      if (0 < (int)uVar18) {
                        pfVar5 = pfVar6 + lVar7;
                        pfVar13 = pfVar5 + lVar7;
                        pfVar14 = pfVar16 + lVar7;
                        pfVar22 = pfVar14 + lVar7;
                        iVar2 = 0;
                        pfVar11 = pfVar6;
                        pfVar20 = pfVar16;
                        do {
                          fVar37 = *pfVar20;
                          fVar38 = (float)local_c0;
                          if (fVar37 <= (float)local_c0) {
                            fVar38 = fVar37;
                          }
                          fVar39 = (float)(-(uint)(fVar37 < valm) & (uint)valm |
                                          ~-(uint)(fVar37 < valm) & (uint)fVar38);
                          fVar37 = *pfVar14;
                          fVar38 = (float)local_c0;
                          if (fVar37 <= (float)local_c0) {
                            fVar38 = fVar37;
                          }
                          fVar38 = (float)(-(uint)(fVar37 < valm) & (uint)valm |
                                          ~-(uint)(fVar37 < valm) & (uint)fVar38);
                          fVar37 = *pfVar22;
                          fVar40 = (float)local_c0;
                          if (fVar37 <= (float)local_c0) {
                            fVar40 = fVar37;
                          }
                          fVar37 = (float)(-(uint)(fVar37 < valm) & (uint)valm |
                                          ~-(uint)(fVar37 < valm) & (uint)fVar40);
                          pbVar23 = pbVar3;
                          if (0 < lVar31) {
                            fVar40 = 3.4028235e+38;
                            pbVar24 = pbVar3;
                            do {
                              fVar41 = ((float)pbVar24[lVar31 * 2] - fVar37) *
                                       ((float)pbVar24[lVar31 * 2] - fVar37) +
                                       ((float)*pbVar24 - fVar39) * ((float)*pbVar24 - fVar39) +
                                       ((float)pbVar24[lVar31] - fVar38) *
                                       ((float)pbVar24[lVar31] - fVar38);
                              if (fVar41 < fVar40) {
                                pbVar23 = pbVar24;
                              }
                              pbVar24 = pbVar24 + 1;
                              if (fVar40 <= fVar41) {
                                fVar41 = fVar40;
                              }
                              fVar40 = fVar41;
                            } while (pbVar24 < pbVar3 + lVar31);
                          }
                          *pfVar20 = fVar39;
                          bVar1 = *pbVar23;
                          *pfVar14 = fVar38;
                          fVar39 = (fVar39 - (float)bVar1) * fVar36;
                          fVar38 = (fVar38 - (float)pbVar23[lVar31]) * fVar36;
                          *pfVar22 = fVar37;
                          fVar37 = (fVar37 - (float)pbVar23[lVar31 * 2]) * fVar36;
                          pfVar20[1] = fVar39 * 7.0 + pfVar20[1];
                          pfVar14[1] = fVar38 * 7.0 + pfVar14[1];
                          pfVar22[1] = fVar37 * 7.0 + pfVar22[1];
                          pfVar11[-1] = fVar39 * 3.0 + pfVar11[-1];
                          pfVar5[-1] = fVar38 * 3.0 + pfVar5[-1];
                          pfVar13[-1] = fVar37 * 3.0 + pfVar13[-1];
                          *pfVar11 = fVar39 * 5.0 + *pfVar11;
                          *pfVar5 = fVar38 * 5.0 + *pfVar5;
                          *pfVar13 = fVar37 * 5.0 + *pfVar13;
                          pfVar11[1] = fVar39 + pfVar11[1];
                          pfVar5[1] = fVar38 + pfVar5[1];
                          pfVar13[1] = fVar37 + pfVar13[1];
                          if (map_indexes) {
                            *puVar35 = (uint)*pbVar23;
                            *local_d0 = (uint)pbVar23[lVar31];
                            local_d0 = local_d0 + 1;
                            *local_b0 = (uint)pbVar23[lVar31 * 2];
                            local_b0 = local_b0 + 1;
                          }
                          else {
                            local_e8._0_4_ = (int)pbVar3;
                            *puVar35 = (int)pbVar23 - (int)local_e8;
                          }
                          pfVar20 = pfVar20 + 1;
                          pfVar14 = pfVar14 + 1;
                          pfVar22 = pfVar22 + 1;
                          pfVar11 = pfVar11 + 1;
                          pfVar5 = pfVar5 + 1;
                          pfVar13 = pfVar13 + 1;
                          puVar35 = puVar35 + 1;
                          iVar2 = iVar2 + 1;
                          uVar32 = this->_width;
                        } while (iVar2 < (int)uVar32);
                        uVar17 = this->_height;
                        uVar21 = uVar32;
                        local_a0 = pfVar6;
                        local_98 = pfVar16;
                        local_88 = lVar34;
                      }
                    }
                    lVar34 = lVar34 + 1;
                    pfVar5 = pfVar6;
                  } while (lVar34 < (int)uVar17);
                  uVar32 = this->_depth;
                }
                local_90 = local_90 + 1;
              } while ((long)local_90 < (long)(int)uVar32);
            }
          }
          else if (uVar17 == 2) {
            if (0 < (int)uVar32) {
              local_d8 = puVar35 + lVar33;
              uVar17 = this->_height;
              local_b0 = (uint *)0x0;
              do {
                if (0 < (int)uVar17) {
                  local_a0 = (float *)this->_data;
                  pbVar3 = local_a8->_data;
                  uVar32 = this->_width;
                  lVar34 = 0;
                  pfVar5 = pfVar6;
                  do {
                    pfVar6 = pfVar16;
                    pfVar16 = pfVar5;
                    if (lVar34 < (int)(uVar17 - 2)) {
                      if (0 < (int)uVar32) {
                        pbVar23 = (byte *)((long)local_a0 +
                                          (ulong)uVar17 * (long)local_b0 * (ulong)uVar32 +
                                          (lVar34 + 1) * (ulong)uVar32);
                        pfVar5 = pfVar6;
                        uVar21 = uVar32;
                        do {
                          *pfVar5 = (float)*pbVar23;
                          pbVar24 = pbVar23 + lVar33;
                          pbVar23 = pbVar23 + 1;
                          pfVar5[lVar7] = (float)*pbVar24;
                          pfVar5 = pfVar5 + 1;
                          uVar21 = uVar21 - 1;
                        } while (uVar21 != 0);
                        goto LAB_00190eb5;
                      }
                    }
                    else {
LAB_00190eb5:
                      if (0 < (int)uVar32) {
                        pfVar5 = pfVar6 + lVar7;
                        pfVar13 = pfVar16 + lVar7;
                        iVar2 = 0;
                        pfVar14 = pfVar16;
                        pfVar22 = pfVar6;
                        do {
                          fVar37 = *pfVar14;
                          fVar38 = (float)local_c0;
                          if (fVar37 <= (float)local_c0) {
                            fVar38 = fVar37;
                          }
                          fVar38 = (float)(-(uint)(fVar37 < valm) & (uint)valm |
                                          ~-(uint)(fVar37 < valm) & (uint)fVar38);
                          fVar37 = *pfVar13;
                          fVar39 = (float)local_c0;
                          if (fVar37 <= (float)local_c0) {
                            fVar39 = fVar37;
                          }
                          fVar37 = (float)(-(uint)(fVar37 < valm) & (uint)valm |
                                          ~-(uint)(fVar37 < valm) & (uint)fVar39);
                          pbVar23 = pbVar3;
                          if (0 < lVar31) {
                            pbVar24 = pbVar3;
                            fVar39 = 3.4028235e+38;
                            do {
                              fVar40 = ((float)*pbVar24 - fVar38) * ((float)*pbVar24 - fVar38) +
                                       ((float)pbVar24[lVar31] - fVar37) *
                                       ((float)pbVar24[lVar31] - fVar37);
                              if (fVar40 < fVar39) {
                                pbVar23 = pbVar24;
                              }
                              pbVar24 = pbVar24 + 1;
                              if (fVar39 <= fVar40) {
                                fVar40 = fVar39;
                              }
                              fVar39 = fVar40;
                            } while (pbVar24 < pbVar3 + lVar31);
                          }
                          *pfVar14 = fVar38;
                          fVar38 = (fVar38 - (float)*pbVar23) * fVar36;
                          *pfVar13 = fVar37;
                          fVar37 = (fVar37 - (float)pbVar23[lVar31]) * fVar36;
                          pfVar14[1] = fVar38 * 7.0 + pfVar14[1];
                          pfVar13[1] = fVar37 * 7.0 + pfVar13[1];
                          pfVar22[-1] = fVar38 * 3.0 + pfVar22[-1];
                          pfVar5[-1] = fVar37 * 3.0 + pfVar5[-1];
                          *pfVar22 = fVar38 * 5.0 + *pfVar22;
                          *pfVar5 = fVar37 * 5.0 + *pfVar5;
                          pfVar22[1] = fVar38 + pfVar22[1];
                          pfVar5[1] = fVar37 + pfVar5[1];
                          if (map_indexes) {
                            *puVar35 = (uint)*pbVar23;
                            *local_d8 = (uint)pbVar23[lVar31];
                            local_d8 = local_d8 + 1;
                          }
                          else {
                            *puVar35 = (int)pbVar23 - (int)pbVar3;
                          }
                          pfVar14 = pfVar14 + 1;
                          pfVar13 = pfVar13 + 1;
                          pfVar22 = pfVar22 + 1;
                          pfVar5 = pfVar5 + 1;
                          puVar35 = puVar35 + 1;
                          iVar2 = iVar2 + 1;
                          uVar32 = this->_width;
                        } while (iVar2 < (int)uVar32);
                        uVar17 = this->_height;
                        local_98 = pfVar16;
                      }
                    }
                    lVar34 = lVar34 + 1;
                    pfVar5 = pfVar6;
                  } while (lVar34 < (int)uVar17);
                  uVar32 = this->_depth;
                }
                local_b0 = (uint *)((long)local_b0 + 1);
              } while ((long)local_b0 < (long)(int)uVar32);
            }
          }
          else if (uVar17 == 1) {
            if (0 < (int)uVar32) {
              uVar17 = this->_height;
              local_d8 = (uint *)0x0;
              do {
                if (0 < (int)uVar17) {
                  puVar15 = this->_data;
                  pbVar3 = local_a8->_data;
                  uVar32 = this->_width;
                  lVar33 = 1;
                  lVar7 = 0;
                  pfVar5 = pfVar6;
                  do {
                    pfVar6 = pfVar16;
                    pfVar16 = pfVar5;
                    if (lVar7 < (int)(uVar17 - 2)) {
                      if (0 < (int)uVar32) {
                        lVar34 = 0;
                        do {
                          pfVar6[lVar34] =
                               (float)puVar15[lVar34 + ((ulong)uVar17 * (long)local_d8 + lVar33) *
                                                       (ulong)uVar32];
                          lVar34 = lVar34 + 1;
                        } while (uVar32 != (uint)lVar34);
                        goto LAB_00190693;
                      }
                    }
                    else {
LAB_00190693:
                      if (0 < (int)uVar32) {
                        iVar2 = 0;
                        pfVar5 = pfVar6;
                        pfVar13 = pfVar16;
                        do {
                          fVar37 = *pfVar13;
                          fVar38 = (float)local_c0;
                          if (fVar37 <= (float)local_c0) {
                            fVar38 = fVar37;
                          }
                          fVar37 = (float)(-(uint)(fVar37 < valm) & (uint)valm |
                                          ~-(uint)(fVar37 < valm) & (uint)fVar38);
                          pbVar23 = pbVar3;
                          if (0 < lVar31) {
                            pbVar24 = pbVar3;
                            fVar38 = 3.4028235e+38;
                            do {
                              fVar39 = ((float)*pbVar24 - fVar37) * ((float)*pbVar24 - fVar37);
                              if (fVar39 < fVar38) {
                                pbVar23 = pbVar24;
                              }
                              pbVar24 = pbVar24 + 1;
                              if (fVar38 <= fVar39) {
                                fVar39 = fVar38;
                              }
                              fVar38 = fVar39;
                            } while (pbVar24 < pbVar3 + lVar31);
                          }
                          *pfVar13 = fVar37;
                          fVar37 = (fVar37 - (float)*pbVar23) * fVar36;
                          pfVar13[1] = fVar37 * 7.0 + pfVar13[1];
                          pfVar5[-1] = fVar37 * 3.0 + pfVar5[-1];
                          *pfVar5 = fVar37 * 5.0 + *pfVar5;
                          pfVar5[1] = fVar37 + pfVar5[1];
                          if (map_indexes) {
                            uVar32 = (uint)*pbVar23;
                          }
                          else {
                            uVar32 = (int)pbVar23 - (int)pbVar3;
                          }
                          pfVar13 = pfVar13 + 1;
                          pfVar5 = pfVar5 + 1;
                          *puVar35 = uVar32;
                          puVar35 = puVar35 + 1;
                          iVar2 = iVar2 + 1;
                          uVar32 = this->_width;
                        } while (iVar2 < (int)uVar32);
                        uVar17 = this->_height;
                      }
                    }
                    lVar7 = lVar7 + 1;
                    lVar33 = lVar33 + 1;
                    pfVar5 = pfVar6;
                  } while (lVar7 < (int)uVar17);
                  uVar32 = this->_depth;
                }
                local_d8 = (uint *)((long)local_d8 + 1);
              } while ((long)local_d8 < (long)(int)uVar32);
            }
          }
          else if (0 < (int)uVar32) {
            uVar17 = this->_height;
            local_88 = 0;
            do {
              if (0 < (int)uVar17) {
                local_90 = this->_data;
                pbVar3 = local_a8->_data;
                lVar34 = 1;
                pfVar5 = pfVar6;
                puVar12 = (uint *)0x0;
                do {
                  local_b0 = puVar12;
                  pfVar6 = pfVar16;
                  pfVar16 = pfVar5;
                  if ((long)local_b0 < (long)(int)(uVar17 - 2)) {
                    uVar21 = this->_spectrum;
                    uVar32 = this->_width;
                    if (0 < (long)(int)uVar21) {
                      uVar18 = this->_depth;
                      puVar15 = local_90 + (local_88 * (ulong)uVar17 + lVar34) * (ulong)uVar32;
                      lVar28 = 0;
                      pfVar5 = pfVar6;
                      do {
                        if (0 < (int)uVar32) {
                          lVar30 = 0;
                          do {
                            pfVar5[lVar30] = (float)puVar15[lVar30];
                            lVar30 = lVar30 + 1;
                          } while (uVar32 != (uint)lVar30);
                        }
                        lVar28 = lVar28 + 1;
                        puVar15 = puVar15 + (ulong)uVar17 * (ulong)uVar32 * (ulong)uVar18;
                        pfVar5 = pfVar5 + lVar7;
                      } while (lVar28 != (int)uVar21);
                    }
                  }
                  else {
                    uVar32 = this->_width;
                  }
                  if (0 < (int)uVar32) {
                    iVar2 = 0;
                    pfVar5 = pfVar6;
                    pfVar13 = pfVar16;
                    do {
                      uVar32 = this->_spectrum;
                      pbVar23 = pbVar3;
                      if (0 < lVar31) {
                        pbVar24 = pbVar3;
                        fVar37 = 3.4028235e+38;
                        do {
                          fVar38 = 0.0;
                          pbVar26 = pbVar24;
                          pfVar14 = pfVar13;
                          uVar17 = uVar32;
                          if (0 < (int)uVar32) {
                            do {
                              fVar39 = *pfVar14;
                              fVar40 = (float)local_c0;
                              if (fVar39 <= (float)local_c0) {
                                fVar40 = fVar39;
                              }
                              fVar39 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                              ~-(uint)(fVar39 < valm) & (uint)fVar40);
                              *pfVar14 = fVar39;
                              fVar39 = fVar39 - (float)*pbVar26;
                              fVar38 = fVar38 + fVar39 * fVar39;
                              uVar17 = uVar17 - 1;
                              pbVar26 = pbVar26 + lVar31;
                              pfVar14 = pfVar14 + lVar7;
                            } while (uVar17 != 0);
                          }
                          pbVar26 = pbVar24;
                          if (fVar37 <= fVar38) {
                            fVar38 = fVar37;
                            pbVar26 = pbVar23;
                          }
                          pbVar23 = pbVar26;
                          pbVar24 = pbVar24 + 1;
                          fVar37 = fVar38;
                        } while (pbVar24 < pbVar3 + lVar31);
                      }
                      if ((int)uVar32 < 1) {
                        if (!map_indexes) goto LAB_001916e8;
                      }
                      else {
                        lVar28 = 4;
                        pbVar24 = pbVar23;
                        uVar17 = uVar32;
                        do {
                          fVar38 = (*(float *)((long)pfVar13 + lVar28 + -4) - (float)*pbVar24) *
                                   fVar36;
                          *(float *)((long)pfVar13 + lVar28) =
                               fVar38 * 7.0 + *(float *)((long)pfVar13 + lVar28);
                          pfVar14 = (float *)((long)pfVar5 + lVar28 + -8);
                          fVar37 = pfVar14[1];
                          pfVar22 = (float *)((long)pfVar5 + lVar28 + -8);
                          *pfVar22 = fVar38 * 3.0 + *pfVar14;
                          pfVar22[1] = fVar38 * 5.0 + fVar37;
                          *(float *)((long)pfVar5 + lVar28) =
                               fVar38 + *(float *)((long)pfVar5 + lVar28);
                          pbVar24 = pbVar24 + lVar31;
                          lVar28 = lVar28 + lVar7 * 4;
                          uVar17 = uVar17 - 1;
                        } while (uVar17 != 0);
                        if (map_indexes) {
                          if (0 < (int)uVar32) {
                            iVar10 = 0;
                            puVar12 = puVar35;
                            do {
                              *puVar12 = (uint)*pbVar23;
                              pbVar23 = pbVar23 + lVar31;
                              iVar10 = iVar10 + 1;
                              puVar12 = puVar12 + lVar33;
                            } while (iVar10 < (int)this->_spectrum);
                          }
                        }
                        else {
LAB_001916e8:
                          local_e8._0_4_ = (int)pbVar3;
                          *puVar35 = (int)pbVar23 - (int)local_e8;
                        }
                      }
                      pfVar13 = pfVar13 + 1;
                      pfVar5 = pfVar5 + 1;
                      puVar35 = puVar35 + 1;
                      iVar2 = iVar2 + 1;
                    } while (iVar2 < (int)this->_width);
                    uVar17 = this->_height;
                  }
                  lVar34 = lVar34 + 1;
                  pfVar5 = pfVar6;
                  puVar12 = (uint *)((long)local_b0 + 1);
                } while ((long)local_b0 + 1 < (long)(int)uVar17);
                uVar32 = this->_depth;
                local_a0 = pfVar6;
                local_98 = pfVar16;
              }
              local_88 = local_88 + 1;
            } while (local_88 < (int)uVar32);
          }
          if (cache._data == (float *)0x0 || cache._is_shared != false) {
            return local_b8;
          }
          operator_delete__(cache._data);
          return local_b8;
        }
      }
    }
  }
  __return_storage_ptr__->_data = (uint *)0x0;
  __return_storage_ptr__->_width = 0;
  __return_storage_ptr__->_height = 0;
  __return_storage_ptr__->_depth = 0;
  __return_storage_ptr__->_spectrum = 0;
  __return_storage_ptr__->_is_shared = false;
  return __return_storage_ptr__;
}

Assistant:

CImg<typename CImg<t>::Tuint>
    get_index(const CImg<t>& colormap, const float dithering=1, const bool map_indexes=true) const {
      if (colormap._spectrum!=_spectrum)
        throw CImgArgumentException(_cimg_instance
                                    "index(): Instance and specified colormap (%u,%u,%u,%u,%p) "
                                    "have incompatible dimensions.",
                                    cimg_instance,
                                    colormap._width,colormap._height,colormap._depth,colormap._spectrum,colormap._data);

      typedef typename CImg<t>::Tuint tuint;
      if (is_empty()) return CImg<tuint>();
      const ulongT
        whd = (ulongT)_width*_height*_depth,
        pwhd = (ulongT)colormap._width*colormap._height*colormap._depth;
      CImg<tuint> res(_width,_height,_depth,map_indexes?_spectrum:1);
      if (dithering>0) { // Dithered versions
        tuint *ptrd = res._data;
        const float ndithering = cimg::cut(dithering,0,1)/16;
        Tfloat valm = 0, valM = (Tfloat)max_min(valm);
        if (valm==valM && valm>=0 && valM<=255) { valm = 0; valM = 255; }
        CImg<Tfloat> cache = get_crop(-1,0,0,0,_width,1,0,_spectrum - 1);
        Tfloat *cache_current = cache.data(1,0,0,0), *cache_next = cache.data(1,1,0,0);
        const ulongT cwhd = (ulongT)cache._width*cache._height*cache._depth;
        switch (_spectrum) {
        case 1 : { // Optimized for scalars
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next; const T *ptrs0 = data(0,y + 1,z,0);
              cimg_forX(*this,x) *(ptrc0++) = (Tfloat)*(ptrs0++);
            }
            Tfloat *ptrs0 = cache_current, *ptrsn0 = cache_next;
            cimg_forX(*this,x) {
              const Tfloat _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp_end = ptrp0 + pwhd; ptrp0<ptrp_end; ) {
                const Tfloat pval0 = (Tfloat)*(ptrp0++) - val0, dist = pval0*pval0;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const Tfloat err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering;
              *ptrs0+=7*err0; *(ptrsn0 - 1)+=3*err0; *(ptrsn0++)+=5*err0; *ptrsn0+=err0;
              if (map_indexes) *(ptrd++) = (tuint)*ptrmin0; else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 2 : { // Optimized for 2D vectors
          tuint *ptrd1 = ptrd + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd;
              const T *ptrs0 = data(0,y + 1,z,0), *ptrs1 = ptrs0 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1,
                  dist = pval0*pval0 + pval1*pval1;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering;
              *ptrs0+=7*err0; *ptrs1+=7*err1;
              *(ptrsn0 - 1)+=3*err0; *(ptrsn1 - 1)+=3*err1;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1;
              *ptrsn0+=err0; *ptrsn1+=err1;
              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 3 : { // Optimized for 3D vectors (colors)
          tuint *ptrd1 = ptrd + whd, *ptrd2 = ptrd1 + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd, *ptrc2 = ptrc1 + cwhd;
              const T *ptrs0 = data(0,y + 1,z,0), *ptrs1 = ptrs0 + whd, *ptrs2 = ptrs1 + whd;
              cimg_forX(*this,x) {
                *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); *(ptrc2++) = (Tfloat)*(ptrs2++);
              }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd, *ptrs2 = ptrs1 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd, *ptrsn2 = ptrsn1 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1,
                _val2 = (Tfloat)*ptrs2, val2 = _val2<valm?valm:_val2>valM?valM:_val2;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp2 = ptrp1 + pwhd,
                     *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0,
                  pval1 = (Tfloat)*(ptrp1++) - val1,
                  pval2 = (Tfloat)*(ptrp2++) - val2,
                  dist = pval0*pval0 + pval1*pval1 + pval2*pval2;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd, *const ptrmin2 = ptrmin1 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering,
                err2 = ((*(ptrs2++)=val2) - (Tfloat)*ptrmin2)*ndithering;

              *ptrs0+=7*err0; *ptrs1+=7*err1; *ptrs2+=7*err2;
              *(ptrsn0 - 1)+=3*err0; *(ptrsn1 - 1)+=3*err1; *(ptrsn2 - 1)+=3*err2;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1; *(ptrsn2++)+=5*err2;
              *ptrsn0+=err0; *ptrsn1+=err1; *ptrsn2+=err2;

              if (map_indexes) {
                *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; *(ptrd2++) = (tuint)*ptrmin2;
              } else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        default : // Generic version
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc = cache_next;
              cimg_forC(*this,c) {
                Tfloat *_ptrc = ptrc; const T *_ptrs = data(0,y + 1,z,c);
                cimg_forX(*this,x) *(_ptrc++) = (Tfloat)*(_ptrs++);
                ptrc+=cwhd;
              }
            }
            Tfloat *ptrs = cache_current, *ptrsn = cache_next;
            cimg_forX(*this,x) {
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin = colormap._data;
              for (const t *ptrp = colormap._data, *ptrp_end = ptrp + pwhd; ptrp<ptrp_end; ++ptrp) {
                Tfloat dist = 0; Tfloat *_ptrs = ptrs; const t *_ptrp = ptrp;
                cimg_forC(*this,c) {
                  const Tfloat _val = *_ptrs, val = _val<valm?valm:_val>valM?valM:_val;
                  dist+=cimg::sqr((*_ptrs=val) - (Tfloat)*_ptrp); _ptrs+=cwhd; _ptrp+=pwhd;
                }
                if (dist<distmin) { ptrmin = ptrp; distmin = dist; }
              }
              const t *_ptrmin = ptrmin; Tfloat *_ptrs = ptrs++, *_ptrsn = (ptrsn++) - 1;
              cimg_forC(*this,c) {
                const Tfloat err = (*(_ptrs++) - (Tfloat)*_ptrmin)*ndithering;
                *_ptrs+=7*err; *(_ptrsn++)+=3*err; *(_ptrsn++)+=5*err; *_ptrsn+=err;
                _ptrmin+=pwhd; _ptrs+=cwhd - 1; _ptrsn+=cwhd - 2;
              }
              if (map_indexes) {
                tuint *_ptrd = ptrd++;
                cimg_forC(*this,c) { *_ptrd = (tuint)*ptrmin; _ptrd+=whd; ptrmin+=pwhd; }
              }
              else *(ptrd++) = (tuint)(ptrmin - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        }